

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

void helper_packuswb_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  
  uVar1 = s->_q_MMXReg[0];
  uVar2 = d->_q_MMXReg[0];
  auVar12._8_8_ = uVar1;
  auVar12._0_8_ = uVar2;
  auVar3._0_2_ = -(ushort)((short)uVar2 < 0);
  sVar5 = (short)(uVar2 >> 0x10);
  auVar3._2_2_ = -(ushort)(sVar5 < 0);
  sVar6 = (short)(uVar2 >> 0x20);
  auVar3._4_2_ = -(ushort)(sVar6 < 0);
  auVar3._6_2_ = -(ushort)((long)uVar2 < 0);
  auVar3._8_2_ = -(ushort)((short)uVar1 < 0);
  sVar9 = (short)(uVar1 >> 0x10);
  auVar3._10_2_ = -(ushort)(sVar9 < 0);
  sVar10 = (short)(uVar1 >> 0x20);
  auVar3._12_2_ = -(ushort)(sVar10 < 0);
  auVar3._14_2_ = -(ushort)((long)uVar1 < 0);
  auVar3 = packsswb(auVar3,auVar3);
  auVar12 = psubusw(auVar12,_DAT_00b6ea20);
  sVar4 = (short)uVar2 - auVar12._0_2_;
  sVar5 = sVar5 - auVar12._2_2_;
  sVar6 = sVar6 - auVar12._4_2_;
  sVar7 = (short)(uVar2 >> 0x30) - auVar12._6_2_;
  sVar8 = (short)uVar1 - auVar12._8_2_;
  sVar9 = sVar9 - auVar12._10_2_;
  sVar10 = sVar10 - auVar12._12_2_;
  sVar11 = (short)(uVar1 >> 0x30) - auVar12._14_2_;
  d->_q_MMXReg[0] =
       ~auVar3._0_8_ &
       CONCAT17((0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11),
                CONCAT16((0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10),
                         CONCAT15((0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9),
                                  CONCAT14((0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 -
                                           (0xff < sVar8),
                                           CONCAT13((0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 -
                                                    (0xff < sVar7),
                                                    CONCAT12((0 < sVar6) * (sVar6 < 0x100) *
                                                             (char)sVar6 - (0xff < sVar6),
                                                             CONCAT11((0 < sVar5) * (sVar5 < 0x100)
                                                                      * (char)sVar5 - (0xff < sVar5)
                                                                      ,(0 < sVar4) * (sVar4 < 0x100)
                                                                       * (char)sVar4 -
                                                                       (0xff < sVar4))))))));
  return;
}

Assistant:

static inline int satub(int x)
{
    if (x < 0) {
        return 0;
    } else if (x > 255) {
        return 255;
    } else {
        return x;
    }
}